

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

R_conflict5 * parse_OWS(QByteArrayView data)

{
  char ch;
  qsizetype qVar1;
  R_conflict5 *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  qsizetype i;
  anon_class_1_0_00000001 is_OWS_char;
  QByteArrayView *in_stack_ffffffffffffffa8;
  bool local_39;
  R_conflict5 *this;
  long local_28;
  _lambda_auto_1__1_ local_19;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = (_lambda_auto_1__1_)0x0;
  local_28 = 0;
  this = in_RDI;
  while( true ) {
    qVar1 = QByteArrayView::size(&local_18);
    local_39 = false;
    if (local_28 < qVar1) {
      ch = QByteArrayView::operator[](&local_18,local_28);
      local_39 = parse_OWS(QByteArrayView)::{lambda(auto:1)#1}::operator()(&local_19,ch);
    }
    if (local_39 == false) break;
    local_28 = local_28 + 1;
  }
  QVar2 = QByteArrayView::first(in_stack_ffffffffffffffa8,0x335a7e);
  in_RDI->ows = QVar2;
  QVar2 = QByteArrayView::sliced(&this->ows,(qsizetype)in_RDI);
  in_RDI->tail = QVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

static constexpr auto parse_OWS(QByteArrayView data) noexcept
{
    struct R {
        QByteArrayView ows, tail;
    };

    constexpr auto is_OWS_char = [](auto ch) { return ch == ' ' || ch == '\t'; };

    qsizetype i = 0;
    while (i < data.size() && is_OWS_char(data[i]))
        ++i;

    return R{data.first(i), data.sliced(i)};
}